

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall
DomLayoutFunction::read(DomLayoutFunction *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  const_iterator o;
  undefined4 in_register_00000034;
  QStringView *size;
  long in_FS_OFFSET;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  QStringBuilder<QLatin1String,_const_QStringView_&> *in_stack_fffffffffffffe28;
  DomLayoutFunction *in_stack_fffffffffffffe30;
  QStringView *a;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  QStringView *in_stack_fffffffffffffe40;
  undefined6 in_stack_fffffffffffffe48;
  byte in_stack_fffffffffffffe4e;
  byte in_stack_fffffffffffffe4f;
  const_iterator local_28 [4];
  long local_8;
  
  size = (QStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe30);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffe30);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x19df20);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)
               CONCAT17(in_stack_fffffffffffffe4f,
                        CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)),
               (size_t)in_stack_fffffffffffffe40);
    QStringView::QStringView<QString,_true>
              (in_stack_fffffffffffffe40,
               (QString *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
    in_stack_fffffffffffffe4f =
         ::operator==((QStringView *)in_stack_fffffffffffffe30,
                      (QStringView *)in_stack_fffffffffffffe28);
    QString::~QString((QString *)0x19df84);
    if ((in_stack_fffffffffffffe4f & 1) == 0) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)
                 CONCAT17(in_stack_fffffffffffffe4f,
                          CONCAT16(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48)),
                 (size_t)in_stack_fffffffffffffe40);
      QStringView::QStringView<QString,_true>
                (in_stack_fffffffffffffe40,
                 (QString *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      in_stack_fffffffffffffe4e =
           ::operator==((QStringView *)in_stack_fffffffffffffe30,
                        (QStringView *)in_stack_fffffffffffffe28);
      QString::~QString((QString *)0x19e035);
      if ((in_stack_fffffffffffffe4e & 1) == 0) {
        in_stack_fffffffffffffe40 = size;
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                   (size_t)in_stack_fffffffffffffe30);
        ::operator+((QLatin1String *)in_stack_fffffffffffffe30,
                    (QStringView *)in_stack_fffffffffffffe28);
        ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe28);
        QXmlStreamReader::raiseError((QString *)in_stack_fffffffffffffe40);
        QString::~QString((QString *)0x19e10b);
      }
      else {
        QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19e049);
        QStringView::toString((QStringView *)in_stack_fffffffffffffe30);
        setAttributeMargin(in_stack_fffffffffffffe30,(QString *)in_stack_fffffffffffffe28);
        QString::~QString((QString *)0x19e08d);
      }
    }
    else {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x19df98);
      QStringView::toString((QStringView *)in_stack_fffffffffffffe30);
      setAttributeSpacing(in_stack_fffffffffffffe30,(QString *)in_stack_fffffffffffffe28);
      QString::~QString((QString *)0x19dfdc);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x19e129);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0019e21d;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      a = size;
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(iVar2,in_stack_fffffffffffffe38),(size_t)size);
      ::operator+((QLatin1String *)a,(QStringView *)in_stack_fffffffffffffe28);
      ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffe28);
      QXmlStreamReader::raiseError((QString *)a);
      QString::~QString((QString *)0x19e202);
    }
  } while (iVar2 != 5);
LAB_0019e21d:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x19e22a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayoutFunction::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"spacing"_s) {
            setAttributeSpacing(attribute.value().toString());
            continue;
        }
        if (name == u"margin"_s) {
            setAttributeMargin(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}